

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
::_reduce_by_F(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
               *this,Tmp_column *column,
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *chainsInF,Index currentIndex)

{
  uint uVar1;
  Column_settings *this_00;
  uint uVar2;
  long lVar3;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
  *this_01;
  Index local_44;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_40;
  uint local_38;
  uint local_34;
  
  this_01 = (this->matrix_).
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + currentIndex;
  local_44 = currentIndex;
  local_40 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)chainsInF;
  uVar2 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
          ::get_pivot_value(this_01);
  this_00 = this->colSettings_;
  uVar1 = (this_00->operators).characteristic_;
  if (uVar1 <= uVar2) {
    uVar2 = uVar2 % uVar1;
  }
  local_34 = (this_00->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2];
  lVar3 = std::_Rb_tree_decrement(&(column->_M_t)._M_impl.super__Rb_tree_header._M_header);
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (&this_00->operators,&local_34,uVar1 - *(int *)(lVar3 + 0x24));
  _add_to(this,this_01,column,local_34);
  local_38 = (this_00->operators).characteristic_ - local_34;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int&,unsigned_int>(local_40,&local_44,&local_38);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_F(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInF,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);  // Reduce with the column col_g
    chainsInF.push_back(currentIndex);
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);  // Reduce with the column col_g
    chainsInF.emplace_back(currentIndex, operators.get_characteristic() - coef);
  }
}